

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static-var-tests.cpp
# Opt level: O3

void StaticVarTest(bool *result)

{
  undefined2 *pointer;
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint64_t memLeakSize;
  uint64_t staticMemSize;
  size_t memLeakCount;
  size_t staticMemCount;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  
  __start(false,"",false);
  pointer = (undefined2 *)operator_new(0x10);
  *pointer = 1;
  *(undefined1 *)(pointer + 1) = 2;
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = 1000;
  *(undefined8 **)(pointer + 4) = puVar1;
  __static_mem_check(&local_20,&local_30,false,"",false);
  if (local_20 == 4) {
    if (local_30 == 0x20) {
      __mem_leak_check(&local_28,&local_38,false,"",false);
      if (local_28 == 2) {
        if (local_38 == 0x18) {
          operator_delete(*(void **)(pointer + 4),8);
          operator_delete(pointer,0x10);
          __mem_leak_check(&local_28,&local_38,false,"",false);
          if ((local_28 == 0) && (local_28 = local_38, local_38 == 0)) {
            __stop_and_free_all_mem();
            return;
          }
          uVar2 = 0x49;
          uVar3 = 0;
        }
        else {
          uVar2 = 0x45;
          uVar3 = 0x18;
          local_28 = local_38;
        }
      }
      else {
        uVar2 = 0x45;
        uVar3 = 2;
      }
    }
    else {
      uVar2 = 0x43;
      uVar3 = 0x20;
      local_28 = local_30;
    }
  }
  else {
    uVar2 = 0x42;
    uVar3 = 4;
    local_28 = local_20;
  }
  printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","StaticVarTest",uVar2,
         local_28,uVar3);
  *result = false;
  return;
}

Assistant:

TEST_CASE(StaticVarTest) {

    START_TEST;

    StaticVarsTestClass* var1 = new StaticVarsTestClass();

    size_t staticMemCount;
    uint64_t staticMemSize;
    MemPlumber::staticMemCheck(staticMemCount, staticMemSize);
    TEST_ASSERT_EQUAL(staticMemCount, 4);
    TEST_ASSERT_EQUAL(staticMemSize, sizeof(StaticClass) + sizeof(int) + sizeof(StaticVarsTestClass) + sizeof(uint64_t));

    CHECK_MEM_LEAK(2, sizeof(StaticVarsTestClass) + sizeof(uint64_t));

    delete var1;

    CHECK_MEM_LEAK(0, 0);

    STOP_TEST;
}